

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *iEnd;
  undefined8 *puVar5;
  ulong *puVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  U32 *pUVar13;
  U32 *pUVar14;
  undefined8 uVar15;
  long lVar16;
  U32 lowestValid;
  int iVar17;
  int iVar18;
  uint uVar19;
  size_t sVar20;
  ulong uVar21;
  ulong uVar22;
  ulong *puVar23;
  BYTE *pBVar24;
  byte bVar25;
  U32 UVar26;
  U32 UVar27;
  ulong *puVar28;
  ulong *puVar29;
  BYTE *pBVar30;
  uint uVar31;
  uint uVar32;
  BYTE *pBVar33;
  int iVar34;
  seqDef *psVar35;
  BYTE *base_1;
  uint uVar36;
  ulong uVar37;
  long lVar38;
  uint uVar39;
  BYTE *iStart;
  uint uVar40;
  ulong uVar41;
  uint uVar42;
  ulong *puVar43;
  ulong uVar44;
  U32 UVar45;
  ulong uVar46;
  ulong *puVar47;
  BYTE *base;
  uint uVar48;
  BYTE *pStart_3;
  BYTE *pStart;
  BYTE *pInLoopLimit;
  U32 maxDistance;
  BYTE *litLimit_w;
  ulong local_158;
  ulong local_148;
  BYTE *local_120;
  ulong local_118;
  ulong *local_d8;
  uint local_cc;
  ulong *local_88;
  
  iEnd = (ulong *)((long)src + srcSize);
  puVar6 = (ulong *)((long)src + (srcSize - 8));
  pBVar11 = (ms->window).base;
  uVar8 = (ms->window).dictLimit;
  iStart = pBVar11 + uVar8;
  uVar48 = *rep;
  local_cc = rep[1];
  puVar43 = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  local_88 = (ulong *)src;
  if (puVar6 <= puVar43) {
LAB_001f8672:
    *rep = uVar48;
    rep[1] = local_cc;
    return (long)iEnd - (long)local_88;
  }
  pBVar12 = (ms->window).dictBase;
  puVar28 = (ulong *)(pBVar12 + uVar8);
  uVar9 = (ms->window).lowLimit;
  uVar39 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar17 = uVar8 - 1;
  puVar1 = (ulong *)((long)iEnd - 7);
  puVar2 = (ulong *)((long)iEnd - 3);
  puVar3 = (ulong *)((long)iEnd - 1);
  puVar4 = iEnd + -4;
LAB_001f6b94:
  iVar34 = (int)puVar43 - (int)pBVar11;
  iVar18 = iVar34 + 1;
  UVar45 = (ms->window).lowLimit;
  UVar27 = ms->loadedDictEnd;
  UVar26 = iVar18 - uVar39;
  if (iVar18 - UVar45 <= uVar39) {
    UVar26 = UVar45;
  }
  if (UVar27 != 0) {
    UVar26 = UVar45;
  }
  uVar19 = iVar18 - uVar48;
  pBVar30 = pBVar11;
  if (uVar19 < uVar8) {
    pBVar30 = pBVar12;
  }
  if (iVar17 - uVar19 < 3) {
LAB_001f6c5f:
    uVar46 = 0;
  }
  else {
    uVar46 = 0;
    if (uVar48 < (iVar34 - UVar26) + 1) {
      if (*(int *)((long)puVar43 + 1U) != *(int *)(pBVar30 + uVar19)) goto LAB_001f6c5f;
      puVar29 = iEnd;
      if (uVar19 < uVar8) {
        puVar29 = puVar28;
      }
      sVar20 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar43 + 5),(BYTE *)((long)(pBVar30 + uVar19) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar29,iStart);
      uVar46 = sVar20 + 4;
    }
  }
  uVar19 = (ms->cParams).minMatch;
  if (uVar19 - 6 < 2) {
    bVar7 = (byte)(ms->cParams).chainLog;
    uVar36 = 1 << (bVar7 & 0x1f);
    pBVar30 = (ms->window).base;
    pBVar24 = (ms->window).dictBase;
    uVar19 = (ms->window).dictLimit;
    uVar44 = (long)puVar43 - (long)pBVar30;
    uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar32 = (uint)uVar44;
    UVar26 = uVar32 - uVar31;
    if (uVar32 - UVar45 <= uVar31) {
      UVar26 = UVar45;
    }
    if (UVar27 != 0) {
      UVar26 = UVar45;
    }
    uVar31 = uVar32 - uVar36;
    if (uVar32 < uVar36) {
      uVar31 = 0;
    }
    iVar18 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    pUVar13 = ms->chainTable;
    pUVar14 = ms->hashTable;
    uVar21 = (ulong)ms->nextToUpdate;
    bVar25 = 0x40 - (char)(ms->cParams).hashLog;
    if (ms->nextToUpdate < uVar32) {
      do {
        uVar41 = (ulong)(*(long *)(pBVar30 + uVar21) * -0x30e4432340650000) >> (bVar25 & 0x3f);
        pUVar13[(uint)uVar21 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar41];
        pUVar14[uVar41] = (uint)uVar21;
        uVar21 = uVar21 + 1;
      } while (uVar21 < (uVar44 & 0xffffffff));
    }
    ms->nextToUpdate = uVar32;
    uVar21 = *puVar43;
    uVar40 = pUVar14[uVar21 * -0x30e4432340650000 >> (bVar25 & 0x3f)];
    if (UVar26 <= uVar40) {
      local_148 = 999999999;
      uVar41 = 3;
      do {
        uVar22 = (ulong)uVar40;
        if (uVar40 < uVar19) {
          if (*(int *)(pBVar24 + uVar22) == (int)*puVar43) {
            sVar20 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar43 + 4),pBVar24 + uVar22 + 4,(BYTE *)iEnd,
                                pBVar24 + uVar19,pBVar30 + uVar19);
            uVar22 = sVar20 + 4;
LAB_001f70be:
            if ((uVar41 < uVar22) &&
               (local_148 = (ulong)((uVar32 + 2) - uVar40), uVar41 = uVar22,
               (ulong *)((long)puVar43 + uVar22) == iEnd)) goto LAB_001f7662;
          }
        }
        else {
          puVar29 = (ulong *)(pBVar30 + uVar22);
          if (*(BYTE *)(uVar41 + (long)puVar29) == *(BYTE *)((long)puVar43 + uVar41)) {
            puVar23 = puVar43;
            if (puVar43 < puVar1) {
              if (*puVar29 == uVar21) {
                lVar38 = 0;
                do {
                  puVar23 = (ulong *)((long)puVar43 + lVar38 + 8);
                  if (puVar1 <= puVar23) {
                    puVar29 = (ulong *)(pBVar30 + lVar38 + uVar22 + 8);
                    goto LAB_001f7078;
                  }
                  lVar16 = lVar38 + uVar22 + 8;
                  lVar38 = lVar38 + 8;
                } while (*(ulong *)(pBVar30 + lVar16) == *puVar23);
                uVar37 = *puVar23 ^ *(ulong *)(pBVar30 + lVar16);
                uVar22 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = (uVar22 >> 3 & 0x1fffffff) + lVar38;
              }
              else {
                uVar37 = *puVar29 ^ uVar21;
                uVar22 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = uVar22 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_001f7078:
              if ((puVar23 < puVar2) && ((int)*puVar29 == (int)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 4);
                puVar29 = (ulong *)((long)puVar29 + 4);
              }
              if ((puVar23 < puVar3) && ((short)*puVar29 == (short)*puVar23)) {
                puVar23 = (ulong *)((long)puVar23 + 2);
                puVar29 = (ulong *)((long)puVar29 + 2);
              }
              if (puVar23 < iEnd) {
                puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar23));
              }
              uVar22 = (long)puVar23 - (long)puVar43;
            }
            goto LAB_001f70be;
          }
        }
        uVar22 = uVar41;
        if ((uVar40 <= uVar31) ||
           ((iVar18 = iVar18 + -1, iVar18 == 0 ||
            (uVar40 = pUVar13[uVar40 & uVar36 - 1], uVar41 = uVar22, uVar40 < UVar26))))
        goto LAB_001f7662;
      } while( true );
    }
    uVar22 = 3;
    local_148 = 999999999;
  }
  else {
    if (uVar19 == 5) {
      bVar7 = (byte)(ms->cParams).chainLog;
      uVar36 = 1 << (bVar7 & 0x1f);
      pBVar30 = (ms->window).base;
      pBVar24 = (ms->window).dictBase;
      uVar19 = (ms->window).dictLimit;
      uVar44 = (long)puVar43 - (long)pBVar30;
      uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar32 = (uint)uVar44;
      UVar26 = uVar32 - uVar31;
      if (uVar32 - UVar45 <= uVar31) {
        UVar26 = UVar45;
      }
      if (UVar27 != 0) {
        UVar26 = UVar45;
      }
      uVar31 = uVar32 - uVar36;
      if (uVar32 < uVar36) {
        uVar31 = 0;
      }
      iVar18 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      pUVar13 = ms->chainTable;
      pUVar14 = ms->hashTable;
      uVar21 = (ulong)ms->nextToUpdate;
      bVar25 = 0x40 - (char)(ms->cParams).hashLog;
      if (ms->nextToUpdate < uVar32) {
        do {
          uVar41 = (ulong)(*(long *)(pBVar30 + uVar21) * -0x30e4432345000000) >> (bVar25 & 0x3f);
          pUVar13[(uint)uVar21 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar41];
          pUVar14[uVar41] = (uint)uVar21;
          uVar21 = uVar21 + 1;
        } while (uVar21 < (uVar44 & 0xffffffff));
      }
      ms->nextToUpdate = uVar32;
      uVar21 = *puVar43;
      uVar40 = pUVar14[uVar21 * -0x30e4432345000000 >> (bVar25 & 0x3f)];
      if (UVar26 <= uVar40) {
        local_148 = 999999999;
        uVar41 = 3;
        do {
          uVar22 = (ulong)uVar40;
          if (uVar40 < uVar19) {
            if (*(int *)(pBVar24 + uVar22) == (int)*puVar43) {
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar43 + 4),pBVar24 + uVar22 + 4,(BYTE *)iEnd,
                                  pBVar24 + uVar19,pBVar30 + uVar19);
              uVar22 = sVar20 + 4;
LAB_001f73f6:
              if ((uVar41 < uVar22) &&
                 (local_148 = (ulong)((uVar32 + 2) - uVar40), uVar41 = uVar22,
                 (ulong *)((long)puVar43 + uVar22) == iEnd)) goto LAB_001f7662;
            }
          }
          else {
            puVar29 = (ulong *)(pBVar30 + uVar22);
            if (*(BYTE *)(uVar41 + (long)puVar29) == *(BYTE *)((long)puVar43 + uVar41)) {
              puVar23 = puVar43;
              if (puVar43 < puVar1) {
                if (*puVar29 == uVar21) {
                  lVar38 = 0;
                  do {
                    puVar23 = (ulong *)((long)puVar43 + lVar38 + 8);
                    if (puVar1 <= puVar23) {
                      puVar29 = (ulong *)(pBVar30 + lVar38 + uVar22 + 8);
                      goto LAB_001f73b0;
                    }
                    lVar16 = lVar38 + uVar22 + 8;
                    lVar38 = lVar38 + 8;
                  } while (*(ulong *)(pBVar30 + lVar16) == *puVar23);
                  uVar37 = *puVar23 ^ *(ulong *)(pBVar30 + lVar16);
                  uVar22 = 0;
                  if (uVar37 != 0) {
                    for (; (uVar37 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  uVar22 = (uVar22 >> 3 & 0x1fffffff) + lVar38;
                }
                else {
                  uVar37 = *puVar29 ^ uVar21;
                  uVar22 = 0;
                  if (uVar37 != 0) {
                    for (; (uVar37 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  uVar22 = uVar22 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_001f73b0:
                if ((puVar23 < puVar2) && ((int)*puVar29 == (int)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 4);
                  puVar29 = (ulong *)((long)puVar29 + 4);
                }
                if ((puVar23 < puVar3) && ((short)*puVar29 == (short)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 2);
                  puVar29 = (ulong *)((long)puVar29 + 2);
                }
                if (puVar23 < iEnd) {
                  puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar23));
                }
                uVar22 = (long)puVar23 - (long)puVar43;
              }
              goto LAB_001f73f6;
            }
          }
          uVar22 = uVar41;
          if ((uVar40 <= uVar31) ||
             ((iVar18 = iVar18 + -1, iVar18 == 0 ||
              (uVar40 = pUVar13[uVar40 & uVar36 - 1], uVar41 = uVar22, uVar40 < UVar26))))
          goto LAB_001f7662;
        } while( true );
      }
    }
    else {
      bVar7 = (byte)(ms->cParams).chainLog;
      uVar36 = 1 << (bVar7 & 0x1f);
      pBVar30 = (ms->window).base;
      pBVar24 = (ms->window).dictBase;
      uVar19 = (ms->window).dictLimit;
      uVar44 = (long)puVar43 - (long)pBVar30;
      uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar32 = (uint)uVar44;
      UVar26 = uVar32 - uVar31;
      if (uVar32 - UVar45 <= uVar31) {
        UVar26 = UVar45;
      }
      if (UVar27 != 0) {
        UVar26 = UVar45;
      }
      uVar31 = uVar32 - uVar36;
      if (uVar32 < uVar36) {
        uVar31 = 0;
      }
      iVar18 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      pUVar13 = ms->chainTable;
      pUVar14 = ms->hashTable;
      uVar21 = (ulong)ms->nextToUpdate;
      bVar25 = 0x20 - (char)(ms->cParams).hashLog;
      if (ms->nextToUpdate < uVar32) {
        do {
          uVar40 = (uint)(*(int *)(pBVar30 + uVar21) * -0x61c8864f) >> (bVar25 & 0x1f);
          pUVar13[(uint)uVar21 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar40];
          pUVar14[uVar40] = (uint)uVar21;
          uVar21 = uVar21 + 1;
        } while (uVar21 < (uVar44 & 0xffffffff));
      }
      ms->nextToUpdate = uVar32;
      uVar21 = *puVar43;
      uVar40 = pUVar14[(uint)((int)uVar21 * -0x61c8864f) >> (bVar25 & 0x1f)];
      if (UVar26 <= uVar40) {
        local_148 = 999999999;
        uVar41 = 3;
        do {
          uVar22 = (ulong)uVar40;
          if (uVar40 < uVar19) {
            if (*(int *)(pBVar24 + uVar22) == (int)uVar21) {
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar43 + 4),pBVar24 + uVar22 + 4,(BYTE *)iEnd,
                                  pBVar24 + uVar19,pBVar30 + uVar19);
              uVar22 = sVar20 + 4;
LAB_001f7603:
              if ((uVar41 < uVar22) &&
                 (local_148 = (ulong)((uVar32 + 2) - uVar40), uVar41 = uVar22,
                 (ulong *)((long)puVar43 + uVar22) == iEnd)) goto LAB_001f7662;
            }
          }
          else {
            puVar29 = (ulong *)(pBVar30 + uVar22);
            if (*(BYTE *)(uVar41 + (long)puVar29) == *(BYTE *)((long)puVar43 + uVar41)) {
              puVar23 = puVar43;
              if (puVar43 < puVar1) {
                if (*puVar29 == *puVar43) {
                  lVar38 = 0;
                  do {
                    puVar23 = (ulong *)((long)puVar43 + lVar38 + 8);
                    if (puVar1 <= puVar23) {
                      puVar29 = (ulong *)(pBVar30 + lVar38 + uVar22 + 8);
                      goto LAB_001f75bd;
                    }
                    lVar16 = lVar38 + uVar22 + 8;
                    lVar38 = lVar38 + 8;
                  } while (*(ulong *)(pBVar30 + lVar16) == *puVar23);
                  uVar37 = *puVar23 ^ *(ulong *)(pBVar30 + lVar16);
                  uVar22 = 0;
                  if (uVar37 != 0) {
                    for (; (uVar37 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  uVar22 = (uVar22 >> 3 & 0x1fffffff) + lVar38;
                }
                else {
                  uVar37 = *puVar43 ^ *puVar29;
                  uVar22 = 0;
                  if (uVar37 != 0) {
                    for (; (uVar37 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  uVar22 = uVar22 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_001f75bd:
                if ((puVar23 < puVar2) && ((int)*puVar29 == (int)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 4);
                  puVar29 = (ulong *)((long)puVar29 + 4);
                }
                if ((puVar23 < puVar3) && ((short)*puVar29 == (short)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 2);
                  puVar29 = (ulong *)((long)puVar29 + 2);
                }
                if (puVar23 < iEnd) {
                  puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar29 == (BYTE)*puVar23));
                }
                uVar22 = (long)puVar23 - (long)puVar43;
              }
              goto LAB_001f7603;
            }
          }
          uVar22 = uVar41;
          if ((uVar40 <= uVar31) ||
             ((iVar18 = iVar18 + -1, iVar18 == 0 ||
              (uVar40 = pUVar13[uVar40 & uVar36 - 1], uVar41 = uVar22, uVar40 < UVar26))))
          goto LAB_001f7662;
        } while( true );
      }
    }
    local_148 = 999999999;
    uVar22 = 3;
  }
LAB_001f7662:
  local_158 = uVar46;
  if (uVar46 < uVar22) {
    local_158 = uVar22;
  }
  if (3 < local_158) {
    puVar29 = puVar43;
    if (uVar22 <= uVar46) {
      local_148 = 0;
      puVar29 = (ulong *)((long)puVar43 + 1U);
    }
    local_120 = (BYTE *)((long)puVar43 + 9);
LAB_001f76b1:
    local_118 = local_148;
    uVar46 = local_158;
    local_d8 = puVar29;
    if (puVar43 < puVar6) {
      puVar29 = (ulong *)((long)puVar43 + 1);
      iVar34 = iVar34 + 1;
      if (local_118 == 0) {
        local_118 = 0;
      }
      else {
        UVar45 = (ms->window).lowLimit;
        UVar27 = iVar34 - uVar39;
        if (iVar34 - UVar45 <= uVar39) {
          UVar27 = UVar45;
        }
        if (ms->loadedDictEnd != 0) {
          UVar27 = UVar45;
        }
        uVar19 = iVar34 - uVar48;
        pBVar30 = pBVar11;
        if (uVar19 < uVar8) {
          pBVar30 = pBVar12;
        }
        if (((2 < iVar17 - uVar19) && (uVar48 < iVar34 - UVar27)) &&
           (*(int *)puVar29 == *(int *)(pBVar30 + uVar19))) {
          puVar23 = iEnd;
          if (uVar19 < uVar8) {
            puVar23 = puVar28;
          }
          sVar20 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar43 + 5),(BYTE *)((long)(pBVar30 + uVar19) + 4),
                              (BYTE *)iEnd,(BYTE *)puVar23,iStart);
          if (sVar20 < 0xfffffffffffffffc) {
            uVar31 = (int)local_118 + 1;
            uVar19 = 0x1f;
            if (uVar31 != 0) {
              for (; uVar31 >> uVar19 == 0; uVar19 = uVar19 - 1) {
              }
            }
            if ((int)((uVar19 ^ 0x1f) + (int)uVar46 * 3 + -0x1e) < (int)(sVar20 + 4) * 3) {
              local_118 = 0;
              uVar46 = sVar20 + 4;
              local_d8 = puVar29;
            }
          }
        }
      }
      uVar19 = (ms->cParams).minMatch;
      uVar31 = (uint)uVar44;
      if (uVar19 - 6 < 2) {
        bVar7 = (byte)(ms->cParams).chainLog;
        uVar40 = 1 << (bVar7 & 0x1f);
        pBVar30 = (ms->window).base;
        uVar21 = (long)puVar29 - (long)pBVar30;
        uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar19 = (ms->window).lowLimit;
        uVar42 = (uint)uVar21;
        uVar36 = uVar42 - uVar32;
        if (uVar42 - uVar19 <= uVar32) {
          uVar36 = uVar19;
        }
        pUVar13 = ms->chainTable;
        if (ms->loadedDictEnd != 0) {
          uVar36 = uVar19;
        }
        uVar19 = uVar42 - uVar40;
        if (uVar42 < uVar40) {
          uVar19 = 0;
        }
        iVar18 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        pBVar24 = (ms->window).dictBase;
        uVar32 = (ms->window).dictLimit;
        pUVar14 = ms->hashTable;
        bVar25 = 0x40 - (char)(ms->cParams).hashLog;
        if (uVar31 < uVar42) {
          uVar44 = uVar44 & 0xffffffff;
          do {
            uVar41 = (ulong)(*(long *)(pBVar30 + uVar44) * -0x30e4432340650000) >> (bVar25 & 0x3f);
            pUVar13[(uint)uVar44 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar41];
            pUVar14[uVar41] = (uint)uVar44;
            uVar44 = uVar44 + 1;
          } while (uVar44 < (uVar21 & 0xffffffff));
        }
        ms->nextToUpdate = uVar42;
        uVar44 = *puVar29;
        uVar31 = pUVar14[uVar44 * -0x30e4432340650000 >> (bVar25 & 0x3f)];
        if (uVar36 <= uVar31) {
          local_148 = 999999999;
          local_158 = 3;
          do {
            uVar41 = (ulong)uVar31;
            if (uVar31 < uVar32) {
              if (*(int *)(pBVar24 + uVar41) == *(int *)puVar29) {
                sVar20 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar43 + 5),pBVar24 + uVar41 + 4,(BYTE *)iEnd,
                                    pBVar24 + uVar32,pBVar30 + uVar32);
                uVar41 = sVar20 + 4;
LAB_001f7b09:
                if ((local_158 < uVar41) &&
                   (local_148 = (ulong)((uVar42 + 2) - uVar31), local_158 = uVar41,
                   (ulong *)((long)puVar29 + uVar41) == iEnd)) goto LAB_001f819e;
              }
            }
            else {
              puVar23 = (ulong *)(pBVar30 + uVar41);
              if (*(BYTE *)(local_158 + (long)puVar23) == *(BYTE *)((long)puVar29 + local_158)) {
                puVar47 = puVar29;
                if (puVar29 < puVar1) {
                  if (*puVar23 == uVar44) {
                    lVar38 = 0;
                    do {
                      puVar47 = (ulong *)(local_120 + lVar38);
                      if (puVar1 <= puVar47) {
                        puVar23 = (ulong *)(pBVar30 + lVar38 + uVar41 + 8);
                        goto LAB_001f7abd;
                      }
                      lVar16 = lVar38 + uVar41 + 8;
                      lVar38 = lVar38 + 8;
                    } while (*(ulong *)(pBVar30 + lVar16) == *puVar47);
                    uVar22 = *puVar47 ^ *(ulong *)(pBVar30 + lVar16);
                    uVar41 = 0;
                    if (uVar22 != 0) {
                      for (; (uVar22 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                      }
                    }
                    uVar41 = (uVar41 >> 3 & 0x1fffffff) + lVar38;
                  }
                  else {
                    uVar22 = *puVar23 ^ uVar44;
                    uVar41 = 0;
                    if (uVar22 != 0) {
                      for (; (uVar22 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                      }
                    }
                    uVar41 = uVar41 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001f7abd:
                  if ((puVar47 < puVar2) && ((int)*puVar23 == (int)*puVar47)) {
                    puVar47 = (ulong *)((long)puVar47 + 4);
                    puVar23 = (ulong *)((long)puVar23 + 4);
                  }
                  if ((puVar47 < puVar3) && ((short)*puVar23 == (short)*puVar47)) {
                    puVar47 = (ulong *)((long)puVar47 + 2);
                    puVar23 = (ulong *)((long)puVar23 + 2);
                  }
                  if (puVar47 < iEnd) {
                    puVar47 = (ulong *)((long)puVar47 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar47));
                  }
                  uVar41 = (long)puVar47 - (long)puVar29;
                }
                goto LAB_001f7b09;
              }
            }
            if ((uVar31 <= uVar19) ||
               ((iVar18 = iVar18 + -1, iVar18 == 0 ||
                (uVar31 = pUVar13[uVar31 & uVar40 - 1], uVar31 < uVar36)))) goto LAB_001f819e;
          } while( true );
        }
      }
      else if (uVar19 == 5) {
        bVar7 = (byte)(ms->cParams).chainLog;
        uVar36 = 1 << (bVar7 & 0x1f);
        pBVar30 = (ms->window).base;
        uVar21 = (long)puVar29 - (long)pBVar30;
        uVar19 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        UVar45 = (ms->window).lowLimit;
        uVar32 = (uint)uVar21;
        UVar27 = uVar32 - uVar19;
        if (uVar32 - UVar45 <= uVar19) {
          UVar27 = UVar45;
        }
        pUVar13 = ms->chainTable;
        if (ms->loadedDictEnd != 0) {
          UVar27 = UVar45;
        }
        uVar19 = uVar32 - uVar36;
        if (uVar32 < uVar36) {
          uVar19 = 0;
        }
        iVar18 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        pBVar24 = (ms->window).dictBase;
        uVar40 = (ms->window).dictLimit;
        pUVar14 = ms->hashTable;
        bVar25 = 0x40 - (char)(ms->cParams).hashLog;
        if (uVar31 < uVar32) {
          uVar44 = uVar44 & 0xffffffff;
          do {
            uVar41 = (ulong)(*(long *)(pBVar30 + uVar44) * -0x30e4432345000000) >> (bVar25 & 0x3f);
            pUVar13[(uint)uVar44 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar41];
            pUVar14[uVar41] = (uint)uVar44;
            uVar44 = uVar44 + 1;
          } while (uVar44 < (uVar21 & 0xffffffff));
        }
        ms->nextToUpdate = uVar32;
        uVar44 = *puVar29;
        uVar31 = pUVar14[uVar44 * -0x30e4432345000000 >> (bVar25 & 0x3f)];
        if (UVar27 <= uVar31) {
          local_148 = 999999999;
          uVar41 = 3;
          do {
            uVar22 = (ulong)uVar31;
            if (uVar31 < uVar40) {
              if (*(int *)(pBVar24 + uVar22) == *(int *)puVar29) {
                sVar20 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar43 + 5),pBVar24 + uVar22 + 4,(BYTE *)iEnd,
                                    pBVar24 + uVar40,pBVar30 + uVar40);
                local_158 = sVar20 + 4;
LAB_001f7e21:
                if ((uVar41 < local_158) &&
                   (local_148 = (ulong)((uVar32 + 2) - uVar31), uVar41 = local_158,
                   (ulong *)((long)puVar29 + local_158) == iEnd)) goto LAB_001f819e;
              }
            }
            else {
              puVar23 = (ulong *)(pBVar30 + uVar22);
              if (*(BYTE *)(uVar41 + (long)puVar23) == *(BYTE *)((long)puVar29 + uVar41)) {
                puVar47 = puVar29;
                if (puVar29 < puVar1) {
                  if (*puVar23 == uVar44) {
                    lVar38 = 0;
                    do {
                      if (puVar1 <= local_120 + lVar38) {
                        puVar23 = (ulong *)(pBVar30 + lVar38 + uVar22 + 8);
                        puVar47 = (ulong *)(local_120 + lVar38);
                        goto LAB_001f7dd5;
                      }
                      lVar16 = lVar38 + uVar22 + 8;
                      uVar37 = *(ulong *)((long)puVar43 + lVar38 + 9);
                      lVar38 = lVar38 + 8;
                    } while (*(ulong *)(pBVar30 + lVar16) == uVar37);
                    uVar37 = uVar37 ^ *(ulong *)(pBVar30 + lVar16);
                    uVar22 = 0;
                    if (uVar37 != 0) {
                      for (; (uVar37 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                      }
                    }
                    local_158 = (uVar22 >> 3 & 0x1fffffff) + lVar38;
                  }
                  else {
                    uVar37 = *puVar23 ^ uVar44;
                    uVar22 = 0;
                    if (uVar37 != 0) {
                      for (; (uVar37 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                      }
                    }
                    local_158 = uVar22 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001f7dd5:
                  if ((puVar47 < puVar2) && ((int)*puVar23 == (int)*puVar47)) {
                    puVar47 = (ulong *)((long)puVar47 + 4);
                    puVar23 = (ulong *)((long)puVar23 + 4);
                  }
                  if ((puVar47 < puVar3) && ((short)*puVar23 == (short)*puVar47)) {
                    puVar47 = (ulong *)((long)puVar47 + 2);
                    puVar23 = (ulong *)((long)puVar23 + 2);
                  }
                  if (puVar47 < iEnd) {
                    puVar47 = (ulong *)((long)puVar47 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar47));
                  }
                  local_158 = (long)puVar47 - (long)puVar29;
                }
                goto LAB_001f7e21;
              }
            }
            local_158 = uVar41;
            if ((uVar31 <= uVar19) ||
               ((iVar18 = iVar18 + -1, iVar18 == 0 ||
                (uVar31 = pUVar13[uVar31 & uVar36 - 1], uVar31 < UVar27)))) goto LAB_001f819e;
          } while( true );
        }
      }
      else {
        bVar7 = (byte)(ms->cParams).chainLog;
        uVar40 = 1 << (bVar7 & 0x1f);
        pBVar30 = (ms->window).base;
        uVar21 = (long)puVar29 - (long)pBVar30;
        uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar19 = (ms->window).lowLimit;
        uVar42 = (uint)uVar21;
        uVar36 = uVar42 - uVar32;
        if (uVar42 - uVar19 <= uVar32) {
          uVar36 = uVar19;
        }
        pUVar13 = ms->chainTable;
        if (ms->loadedDictEnd != 0) {
          uVar36 = uVar19;
        }
        uVar19 = uVar42 - uVar40;
        if (uVar42 < uVar40) {
          uVar19 = 0;
        }
        iVar18 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        pBVar24 = (ms->window).dictBase;
        uVar32 = (ms->window).dictLimit;
        pUVar14 = ms->hashTable;
        bVar25 = 0x20 - (char)(ms->cParams).hashLog;
        if (uVar31 < uVar42) {
          uVar44 = uVar44 & 0xffffffff;
          do {
            uVar31 = (uint)(*(int *)(pBVar30 + uVar44) * -0x61c8864f) >> (bVar25 & 0x1f);
            pUVar13[(uint)uVar44 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar31];
            pUVar14[uVar31] = (uint)uVar44;
            uVar44 = uVar44 + 1;
          } while (uVar44 < (uVar21 & 0xffffffff));
        }
        ms->nextToUpdate = uVar42;
        iVar10 = *(int *)puVar29;
        uVar31 = pUVar14[(uint)(iVar10 * -0x61c8864f) >> (bVar25 & 0x1f)];
        if (uVar36 <= uVar31) {
          local_148 = 999999999;
          local_158 = 3;
          do {
            uVar44 = (ulong)uVar31;
            if (uVar31 < uVar32) {
              if (*(int *)(pBVar24 + uVar44) == iVar10) {
                sVar20 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar43 + 5),pBVar24 + uVar44 + 4,(BYTE *)iEnd,
                                    pBVar24 + uVar32,pBVar30 + uVar32);
                uVar44 = sVar20 + 4;
LAB_001f8151:
                if ((local_158 < uVar44) &&
                   (local_148 = (ulong)((uVar42 + 2) - uVar31), local_158 = uVar44,
                   (ulong *)((long)puVar29 + uVar44) == iEnd)) goto LAB_001f819e;
              }
            }
            else {
              puVar23 = (ulong *)(pBVar30 + uVar44);
              if (*(BYTE *)(local_158 + (long)puVar23) == *(BYTE *)((long)puVar29 + local_158)) {
                puVar47 = puVar29;
                if (puVar29 < puVar1) {
                  if (*puVar23 == *puVar29) {
                    lVar38 = 0;
                    do {
                      puVar47 = (ulong *)(local_120 + lVar38);
                      if (puVar1 <= puVar47) {
                        puVar23 = (ulong *)(pBVar30 + lVar38 + uVar44 + 8);
                        goto LAB_001f8105;
                      }
                      lVar16 = lVar38 + uVar44 + 8;
                      lVar38 = lVar38 + 8;
                    } while (*(ulong *)(pBVar30 + lVar16) == *puVar47);
                    uVar41 = *puVar47 ^ *(ulong *)(pBVar30 + lVar16);
                    uVar44 = 0;
                    if (uVar41 != 0) {
                      for (; (uVar41 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                      }
                    }
                    uVar44 = (uVar44 >> 3 & 0x1fffffff) + lVar38;
                  }
                  else {
                    uVar41 = *puVar29 ^ *puVar23;
                    uVar44 = 0;
                    if (uVar41 != 0) {
                      for (; (uVar41 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                      }
                    }
                    uVar44 = uVar44 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001f8105:
                  if ((puVar47 < puVar2) && ((int)*puVar23 == (int)*puVar47)) {
                    puVar47 = (ulong *)((long)puVar47 + 4);
                    puVar23 = (ulong *)((long)puVar23 + 4);
                  }
                  if ((puVar47 < puVar3) && ((short)*puVar23 == (short)*puVar47)) {
                    puVar47 = (ulong *)((long)puVar47 + 2);
                    puVar23 = (ulong *)((long)puVar23 + 2);
                  }
                  if (puVar47 < iEnd) {
                    puVar47 = (ulong *)((long)puVar47 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar47));
                  }
                  uVar44 = (long)puVar47 - (long)puVar29;
                }
                goto LAB_001f8151;
              }
            }
            if ((uVar31 <= uVar19) ||
               ((iVar18 = iVar18 + -1, iVar18 == 0 ||
                (uVar31 = pUVar13[uVar31 & uVar40 - 1], uVar31 < uVar36)))) goto LAB_001f819e;
          } while( true );
        }
      }
    }
    goto LAB_001f828b;
  }
  puVar43 = (ulong *)((long)puVar43 + ((long)puVar43 - (long)local_88 >> 8) + 1);
  goto LAB_001f8642;
LAB_001f819e:
  if (local_158 < 4) goto LAB_001f828b;
  uVar31 = (int)local_118 + 1;
  uVar19 = 0x1f;
  if (uVar31 != 0) {
    for (; uVar31 >> uVar19 == 0; uVar19 = uVar19 - 1) {
    }
  }
  uVar31 = (int)local_148 + 1;
  iVar18 = 0x1f;
  if (uVar31 != 0) {
    for (; uVar31 >> iVar18 == 0; iVar18 = iVar18 + -1) {
    }
  }
  local_120 = local_120 + 1;
  uVar44 = uVar21;
  puVar43 = puVar29;
  local_148 = local_148;
  if ((int)local_158 * 4 - iVar18 <= (int)((uVar19 ^ 0x1f) + (int)uVar46 * 4 + -0x1b))
  goto LAB_001f828b;
  goto LAB_001f76b1;
LAB_001f828b:
  if (local_118 == 0) {
    UVar45 = 1;
    uVar19 = uVar48;
  }
  else {
    pBVar33 = (BYTE *)((long)local_d8 + (2 - (long)(pBVar11 + local_118)));
    pBVar24 = iStart;
    pBVar30 = pBVar11;
    if ((uint)pBVar33 < uVar8) {
      pBVar24 = pBVar12 + uVar9;
      pBVar30 = pBVar12;
    }
    if ((local_88 < local_d8) && (uVar44 = (ulong)pBVar33 & 0xffffffff, pBVar24 < pBVar30 + uVar44))
    {
      pBVar30 = pBVar30 + uVar44;
      do {
        pBVar30 = pBVar30 + -1;
        puVar43 = (ulong *)((long)local_d8 + -1);
        if ((*(BYTE *)puVar43 != *pBVar30) ||
           (uVar46 = uVar46 + 1, local_d8 = puVar43, puVar43 <= local_88)) break;
      } while (pBVar24 < pBVar30);
    }
    UVar45 = (int)local_118 + 1;
    uVar19 = (int)local_118 - 2;
    local_cc = uVar48;
  }
  uVar44 = (long)local_d8 - (long)local_88;
  puVar43 = (ulong *)seqStore->lit;
  if (puVar4 < local_d8) {
    puVar29 = puVar43;
    puVar23 = local_88;
    if (local_88 <= puVar4) {
      puVar29 = (ulong *)((long)puVar43 + ((long)puVar4 - (long)local_88));
      uVar21 = local_88[1];
      *puVar43 = *local_88;
      puVar43[1] = uVar21;
      puVar23 = puVar4;
      if (0x10 < (long)puVar4 - (long)local_88) {
        lVar38 = 0x10;
        do {
          uVar15 = *(undefined8 *)((BYTE *)((long)local_88 + lVar38) + 8);
          puVar5 = (undefined8 *)((long)puVar43 + lVar38);
          *puVar5 = *(undefined8 *)((long)local_88 + lVar38);
          puVar5[1] = uVar15;
          pBVar30 = (BYTE *)((long)local_88 + lVar38 + 0x10);
          uVar15 = *(undefined8 *)(pBVar30 + 8);
          puVar5[2] = *(undefined8 *)pBVar30;
          puVar5[3] = uVar15;
          lVar38 = lVar38 + 0x20;
        } while (puVar5 + 4 < puVar29);
      }
    }
    if (puVar23 < local_d8) {
      lVar38 = 0;
      do {
        *(BYTE *)((long)puVar29 + lVar38) = *(BYTE *)((long)puVar23 + lVar38);
        lVar38 = lVar38 + 1;
      } while ((long)local_d8 - (long)puVar23 != lVar38);
    }
  }
  else {
    uVar21 = local_88[1];
    *puVar43 = *local_88;
    puVar43[1] = uVar21;
    pBVar30 = seqStore->lit;
    if (uVar44 < 0x11) {
      seqStore->lit = pBVar30 + uVar44;
      psVar35 = seqStore->sequences;
      goto LAB_001f8489;
    }
    uVar21 = local_88[3];
    *(ulong *)(pBVar30 + 0x10) = local_88[2];
    *(ulong *)(pBVar30 + 0x18) = uVar21;
    if (0x20 < (long)uVar44) {
      lVar38 = 0;
      do {
        pBVar33 = (BYTE *)((long)local_88 + lVar38 + 0x20);
        uVar15 = *(undefined8 *)(pBVar33 + 8);
        pBVar24 = pBVar30 + lVar38 + 0x20;
        *(undefined8 *)pBVar24 = *(undefined8 *)pBVar33;
        *(undefined8 *)(pBVar24 + 8) = uVar15;
        pBVar33 = (BYTE *)((long)local_88 + lVar38 + 0x30);
        uVar15 = *(undefined8 *)(pBVar33 + 8);
        *(undefined8 *)(pBVar24 + 0x10) = *(undefined8 *)pBVar33;
        *(undefined8 *)(pBVar24 + 0x18) = uVar15;
        lVar38 = lVar38 + 0x20;
      } while (pBVar24 + 0x20 < pBVar30 + uVar44);
    }
  }
  seqStore->lit = seqStore->lit + uVar44;
  psVar35 = seqStore->sequences;
  if (0xffff < uVar44) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001f8489:
  psVar35->litLength = (U16)uVar44;
  psVar35->offset = UVar45;
  if (0xffff < uVar46 - 3) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
  }
  psVar35->matchLength = (U16)(uVar46 - 3);
  psVar35 = psVar35 + 1;
  seqStore->sequences = psVar35;
  for (puVar43 = (ulong *)((long)local_d8 + uVar46); uVar48 = uVar19, local_88 = puVar43,
      puVar43 <= puVar6; puVar43 = (ulong *)((long)puVar43 + sVar20 + 4)) {
    iVar18 = (int)puVar43 - (int)pBVar11;
    UVar45 = (ms->window).lowLimit;
    UVar27 = iVar18 - uVar39;
    if (iVar18 - UVar45 <= uVar39) {
      UVar27 = UVar45;
    }
    if (ms->loadedDictEnd != 0) {
      UVar27 = UVar45;
    }
    uVar19 = iVar18 - local_cc;
    pBVar30 = pBVar11;
    if (uVar19 < uVar8) {
      pBVar30 = pBVar12;
    }
    if (((iVar17 - uVar19 < 3) || (iVar18 - UVar27 <= local_cc)) ||
       ((int)*puVar43 != *(int *)(pBVar30 + uVar19))) break;
    puVar29 = iEnd;
    if (uVar19 < uVar8) {
      puVar29 = puVar28;
    }
    sVar20 = ZSTD_count_2segments
                       ((BYTE *)((long)puVar43 + 4),(BYTE *)((long)(pBVar30 + uVar19) + 4),
                        (BYTE *)iEnd,(BYTE *)puVar29,iStart);
    if (puVar43 <= puVar4) {
      puVar29 = (ulong *)seqStore->lit;
      uVar46 = puVar43[1];
      *puVar29 = *puVar43;
      puVar29[1] = uVar46;
      psVar35 = seqStore->sequences;
    }
    psVar35->litLength = 0;
    psVar35->offset = 1;
    if (0xffff < sVar20 + 1) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar35->matchLength = (U16)(sVar20 + 1);
    psVar35 = psVar35 + 1;
    seqStore->sequences = psVar35;
    uVar19 = local_cc;
    local_cc = uVar48;
  }
LAB_001f8642:
  if (puVar6 <= puVar43) goto LAB_001f8672;
  goto LAB_001f6b94;
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1);
}